

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O3

void __thiscall NPC::Killed(NPC *this,Character *from,int amount,int spell_id)

{
  size_t *psVar1;
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *plVar2;
  pointer pcVar3;
  byte bVar4;
  ushort uVar5;
  undefined2 uVar6;
  World *pWVar7;
  pointer puVar8;
  EIF *pEVar9;
  Map *pMVar10;
  Party *this_00;
  long lVar11;
  pointer ppNVar12;
  NPC *this_01;
  Quest_Context *this_02;
  _Base_ptr this_03;
  double dVar13;
  map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
  *pmVar14;
  undefined8 uVar15;
  bool bVar16;
  int sharemode;
  int iVar17;
  int iVar18;
  mapped_type *pmVar19;
  NPC_Data *pNVar20;
  undefined4 extraout_var;
  _Node *p_Var21;
  _List_node_base *p_Var22;
  ENF_Data *pEVar23;
  _Rb_tree_node_base *p_Var24;
  _List_iterator<NPC_*> __first;
  __normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_> __dest;
  Quest *this_04;
  _Base_ptr p_Var25;
  ulong uVar26;
  NPC **ppNVar27;
  size_t __n;
  short sVar28;
  uint uVar29;
  unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_> *checkdrop;
  pointer puVar30;
  _List_node_base *p_Var31;
  pointer ppNVar32;
  list<Character_*,_std::allocator<Character_*>_> *plVar33;
  _List_iterator<NPC_*> __last;
  NPC_Drop *pNVar34;
  Character *pCVar35;
  NPC *pNVar36;
  NPC **ppNVar37;
  _List_node_base *p_Var38;
  bool bVar39;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  shared_ptr<Map_Item> newitem;
  vector<NPC_Drop_*,_std::allocator<NPC_Drop_*>_> drops;
  set<Party_*,_std::less<Party_*>,_std::allocator<Party_*>_> parties;
  undefined1 local_120 [16];
  undefined1 local_110 [28];
  uint local_f4;
  int local_f0;
  int local_ec;
  _List_node_base *local_e8;
  Character *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [40];
  undefined1 local_a0 [32];
  _Rb_tree_node_base *local_80;
  size_t local_78;
  undefined4 local_6c;
  double local_68;
  undefined8 local_60;
  uint local_58;
  int local_54;
  Character *local_50;
  _List_node_base *local_48;
  ulong local_40;
  _List_node_base *local_38;
  
  pWVar7 = this->map->world;
  pcVar3 = local_a0 + 0x10;
  local_110._16_8_ = from;
  local_ec = spell_id;
  local_a0._0_8_ = pcVar3;
  local_54 = amount;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"DropRate","");
  pmVar19 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar7->config,(key_type *)local_a0);
  local_e8 = (_List_node_base *)util::variant::GetFloat(pmVar19);
  if ((pointer)local_a0._0_8_ != pcVar3) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  pWVar7 = this->map->world;
  local_a0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"ExpRate","");
  pmVar19 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar7->config,(key_type *)local_a0);
  local_68 = util::variant::GetFloat(pmVar19);
  if ((pointer)local_a0._0_8_ != pcVar3) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  pWVar7 = this->map->world;
  local_a0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"ShareMode","");
  pmVar19 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar7->config,(key_type *)local_a0);
  local_f4 = util::variant::GetInt(pmVar19);
  if ((pointer)local_a0._0_8_ != pcVar3) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  pWVar7 = this->map->world;
  local_a0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"PartyShareMode","");
  pmVar19 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar7->config,(key_type *)local_a0);
  sharemode = util::variant::GetInt(pmVar19);
  if ((pointer)local_a0._0_8_ != pcVar3) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  pWVar7 = this->map->world;
  local_a0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"DropRateMode","");
  pmVar19 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar7->config,(key_type *)local_a0);
  iVar17 = util::variant::GetInt(pmVar19);
  if ((pointer)local_a0._0_8_ != pcVar3) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_a0._24_8_ = local_a0 + 8;
  local_a0._8_4_ = _S_red;
  local_a0._16_8_ = 0;
  local_78 = 0;
  this->alive = false;
  local_80 = (_Rb_tree_node_base *)local_a0._24_8_;
  dVar13 = Timer::GetTime();
  this->dead_since = (double)(int)dVar13;
  if (iVar17 == 3) {
    World::GetNpcData(this->map->world,(short)this->id);
    util::rand();
    local_e8 = (_List_node_base *)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
    pNVar20 = World::GetNpcData(this->map->world,(short)this->id);
    for (puVar30 = (pNVar20->drops).
                   super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        puVar30 !=
        (pNVar20->drops).
        super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; puVar30 = puVar30 + 1) {
      pNVar34 = (puVar30->_M_t).super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t
                .super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl;
      if ((pNVar34->chance_offset <= (double)local_e8) &&
         ((double)local_e8 < pNVar34->chance_offset + pNVar34->chance)) goto LAB_0017aa82;
    }
LAB_0017aa63:
    pNVar34 = (NPC_Drop *)0x0;
  }
  else {
    if (iVar17 == 2) {
      pNVar20 = World::GetNpcData(this->map->world,(short)this->id);
      puVar8 = (pNVar20->drops).
               super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar30 = (pNVar20->drops).
                     super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar30 != puVar8;
          puVar30 = puVar30 + 1) {
        util::rand();
        pNVar34 = (puVar30->_M_t).super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>.
                  _M_t.super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                  super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl;
        if ((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) <=
            pNVar34->chance * (double)local_e8) goto LAB_0017aa82;
      }
      goto LAB_0017aa63;
    }
    if (iVar17 != 1) goto LAB_0017aa63;
    local_d8._0_8_ = (NPC *)0x0;
    local_d8._8_8_ = (NPC *)0x0;
    local_c8._0_8_ = (NPC **)0x0;
    pNVar20 = World::GetNpcData(this->map->world,(short)this->id);
    puVar30 = (pNVar20->drops).
              super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = (pNVar20->drops).
             super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar30 != puVar8) {
      do {
        util::rand();
        pNVar36 = (NPC *)(puVar30->_M_t).
                         super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                         super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                         super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl;
        if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) <=
            *(double *)&pNVar36->alive * (double)local_e8) {
          local_120._0_8_ = pNVar36;
          std::vector<NPC_Drop*,std::allocator<NPC_Drop*>>::emplace_back<NPC_Drop*>
                    ((vector<NPC_Drop*,std::allocator<NPC_Drop*>> *)local_d8,(NPC_Drop **)local_120)
          ;
        }
        puVar30 = puVar30 + 1;
      } while (puVar30 != puVar8);
    }
    if (local_d8._8_8_ == local_d8._0_8_) {
      pNVar34 = (NPC_Drop *)0x0;
      if ((NPC *)local_d8._8_8_ != (NPC *)0x0) goto LAB_0017aa75;
    }
    else {
      iVar17 = util::rand();
      pNVar34 = *(NPC_Drop **)(local_d8._0_8_ + (long)iVar17 * 8);
LAB_0017aa75:
      operator_delete((void *)local_d8._0_8_,local_c8._0_8_ - local_d8._0_8_);
    }
  }
LAB_0017aa82:
  local_60._0_4_ = 0;
  local_60._4_4_ = 0;
  if (local_f4 == 1) {
    p_Var22 = (this->damagelist).
              super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    iVar17 = 0;
    if (p_Var22 == (_List_node_base *)&this->damagelist) goto LAB_0017aac3;
    local_50 = (Character *)0x0;
    do {
      iVar18 = *(int *)&(p_Var22[1]._M_next)->_M_prev;
      if (iVar17 < iVar18) {
        local_50 = (Character *)(p_Var22[1]._M_next)->_M_next;
        iVar17 = iVar18;
      }
      p_Var22 = p_Var22->_M_next;
    } while (p_Var22 != (_List_node_base *)&this->damagelist);
  }
  else {
LAB_0017aac3:
    local_50 = (Character *)0x0;
  }
  if (pNVar34 == (NPC_Drop *)0x0) {
    local_e0 = (Character *)local_110._16_8_;
    uVar29 = 0;
    local_f0 = 0;
    goto LAB_0017ae09;
  }
  uVar5 = pNVar34->id;
  uVar29 = (uint)uVar5;
  iVar17 = util::rand();
  pWVar7 = this->map->world;
  local_d8._0_8_ = (NPC *)local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"MaxItem","");
  pmVar19 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar7->config,(key_type *)local_d8);
  iVar18 = util::variant::GetInt(pmVar19);
  local_f0 = iVar17;
  if (iVar18 < iVar17) {
    local_f0 = iVar18;
  }
  if ((NPC *)local_d8._0_8_ != (NPC *)local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8._0_8_ + 1);
  }
  local_60._0_4_ = 0;
  local_60._4_4_ = 0;
  if (uVar5 == 0) {
    local_e0 = (Character *)local_110._16_8_;
    uVar29 = 0;
    goto LAB_0017ae09;
  }
  if ((local_f0 < 1) ||
     (pEVar9 = this->map->world->eif,
     uVar26 = ((long)(pEVar9->data).
                     super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pEVar9->data).
                     super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7,
     uVar26 < uVar5 || uVar26 - uVar5 == 0)) goto LAB_0017adff;
  local_60._0_4_ = Map::GenerateItemID(this->map);
  local_60._4_4_ = extraout_var;
  iVar17 = Character::PlayerID((Character *)local_110._16_8_);
  local_e8 = (_List_node_base *)Timer::GetTime();
  pWVar7 = this->map->world;
  local_d8._0_8_ = (NPC *)local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"ProtectNPCDrop","");
  pmVar19 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar7->config,(key_type *)local_d8);
  iVar18 = util::variant::GetInt(pmVar19);
  local_120._8_8_ = operator_new(0x28);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001d19a0;
  local_120._0_8_ = local_120._8_8_ + 0x10;
  uVar6 = *(undefined2 *)&this->x;
  *(short *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_120._8_8_ + 0x10))->
             _vptr__Sp_counted_base = (short)local_60;
  *(ushort *)
   ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_120._8_8_ + 0x10))->
           _vptr__Sp_counted_base + 2) = uVar5;
  *(int *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_120._8_8_ + 0x10))->
                  _vptr__Sp_counted_base + 4) = local_f0;
  *(undefined2 *)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_120._8_8_ + 0x10))->_M_use_count = uVar6
  ;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_120._8_8_ + 0x10))->_M_weak_count = iVar17
  ;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_120._8_8_ + 0x20))->_vptr__Sp_counted_base
       = (_func_int **)((double)local_e8 + (double)iVar18);
  if ((NPC *)local_d8._0_8_ != (NPC *)local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8._0_8_ + 1);
  }
  pMVar10 = this->map;
  p_Var21 = std::__cxx11::list<std::shared_ptr<Map_Item>,std::allocator<std::shared_ptr<Map_Item>>>
            ::_M_create_node<std::shared_ptr<Map_Item>const&>
                      ((list<std::shared_ptr<Map_Item>,std::allocator<std::shared_ptr<Map_Item>>> *)
                       &pMVar10->items,(shared_ptr<Map_Item> *)local_120);
  std::__detail::_List_node_base::_M_hook(&p_Var21->super__List_node_base);
  psVar1 = &(pMVar10->items).
            super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  switch(local_f4) {
  case 0:
    pCVar35 = (Character *)local_110._16_8_;
    goto LAB_0017adcc;
  case 1:
    pCVar35 = local_50;
    goto LAB_0017adcc;
  case 2:
    iVar17 = util::rand();
    p_Var31 = (this->damagelist).
              super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var31 != (_List_node_base *)&this->damagelist) {
      iVar18 = 0;
      do {
        bVar39 = Character::InRange((Character *)(p_Var31[1]._M_next)->_M_next,this);
        if (bVar39) {
          p_Var22 = p_Var31[1]._M_next;
          if (iVar18 <= iVar17 && iVar17 < *(int *)&p_Var22->_M_prev) goto LAB_0017adc4;
          iVar18 = iVar18 + *(int *)&p_Var22->_M_prev;
        }
        p_Var31 = p_Var31->_M_next;
      } while (p_Var31 != (_List_node_base *)&this->damagelist);
    }
    break;
  case 3:
    iVar17 = util::rand();
    plVar2 = &this->damagelist;
    p_Var22 = (plVar2->
              super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
              )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var22 != (_List_node_base *)plVar2) {
      iVar18 = 0;
      do {
        bVar39 = Character::InRange((Character *)(p_Var22[1]._M_next)->_M_next,this);
        if (bVar39) {
          if (iVar17 == iVar18) {
            p_Var22 = p_Var22[1]._M_next;
            goto LAB_0017adc4;
          }
          iVar18 = iVar18 + 1;
        }
        p_Var22 = p_Var22->_M_next;
      } while (p_Var22 != (_List_node_base *)plVar2);
    }
  }
  pCVar35 = (Character *)0x0;
LAB_0017adcc:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_);
  }
  if (pCVar35 == (Character *)0x0) {
LAB_0017adff:
    local_e0 = (Character *)local_110._16_8_;
  }
  else {
    iVar17 = Character::PlayerID(pCVar35);
    *(int *)((long)&((this->map->items).
                     super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                     ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next)->_M_prev + 4) =
         iVar17;
    local_e0 = pCVar35;
  }
LAB_0017ae09:
  p_Var22 = (this->map->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  local_38 = (_List_node_base *)&this->map->characters;
  if (p_Var22 != local_38) {
    local_6c = 0x2c;
    if (local_ec == -1) {
      local_6c = 0x1a;
    }
    p_Var31 = (_List_node_base *)&this->damagelist;
    bVar39 = local_f4 == 0;
    local_40 = (ulong)local_f4;
    local_58 = uVar29;
    local_48 = p_Var31;
    do {
      pCVar35 = (Character *)p_Var22[1]._M_next;
      p_Var38 = p_Var31;
      do {
        p_Var38 = (((_List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                     *)&p_Var38->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        local_e8 = p_Var22;
        if (p_Var38 == p_Var31) {
          bVar16 = Character::InRange(pCVar35,this);
          if (!bVar16) goto LAB_0017b495;
          break;
        }
      } while (*(Character **)p_Var38[1]._M_next != pCVar35);
      PacketBuilder::PacketBuilder
                ((PacketBuilder *)local_d8,(PacketFamily)local_6c,PACKET_SPEC,0x1a);
      pNVar20 = World::GetNpcData(this->map->world,(short)this->id);
      pEVar23 = NPC_Data::ENF(pNVar20);
      bVar16 = false;
      if ((p_Var38 != p_Var31) && (pEVar23->exp != 0)) {
        if (local_f4 < 4) {
          (*(code *)(&DAT_001a6af0 + *(int *)(&DAT_001a6af0 + local_40 * 4)))();
          return;
        }
        pWVar7 = this->map->world;
        local_120._0_8_ = local_120 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"MaxExp","");
        pmVar19 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&pWVar7->config,(key_type *)local_120);
        iVar18 = util::variant::GetInt(pmVar19);
        iVar17 = pCVar35->exp;
        if (iVar18 < pCVar35->exp) {
          iVar17 = iVar18;
        }
        pCVar35->exp = iVar17;
        if ((NPC_Drop *)local_120._0_8_ != (NPC_Drop *)(local_120 + 0x10)) {
          operator_delete((void *)local_120._0_8_,local_110._0_8_ + 1);
        }
        bVar16 = false;
        while( true ) {
          bVar4 = pCVar35->level;
          pWVar7 = this->map->world;
          local_120._0_8_ = local_120 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"MaxLevel","");
          pmVar19 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&pWVar7->config,(key_type *)local_120);
          iVar17 = util::variant::GetInt(pmVar19);
          if (iVar17 <= (int)(uint)bVar4) break;
          iVar17 = pCVar35->exp;
          iVar18 = (this->map->world->exp_table)._M_elems[(ulong)pCVar35->level + 1];
          if ((NPC *)local_120._0_8_ != (NPC *)(local_120 + 0x10)) {
            operator_delete((void *)local_120._0_8_,local_110._0_8_ + 1);
          }
          if (iVar17 < iVar18) goto LAB_0017b2ee;
          pCVar35->level = pCVar35->level + '\x01';
          pWVar7 = this->map->world;
          local_120._0_8_ = local_120 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"StatPerLevel","");
          pmVar19 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&pWVar7->config,(key_type *)local_120);
          iVar17 = util::variant::GetInt(pmVar19);
          pCVar35->statpoints = pCVar35->statpoints + iVar17;
          if ((NPC_Drop *)local_120._0_8_ != (NPC_Drop *)(local_120 + 0x10)) {
            operator_delete((void *)local_120._0_8_,local_110._0_8_ + 1);
          }
          pWVar7 = this->map->world;
          local_120._0_8_ = local_120 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"SkillPerLevel","");
          pmVar19 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&pWVar7->config,(key_type *)local_120);
          iVar17 = util::variant::GetInt(pmVar19);
          pCVar35->skillpoints = pCVar35->skillpoints + iVar17;
          if ((NPC_Drop *)local_120._0_8_ != (NPC_Drop *)(local_120 + 0x10)) {
            operator_delete((void *)local_120._0_8_,local_110._0_8_ + 1);
          }
          bVar16 = true;
          Character::CalculateStats(pCVar35,true);
        }
        if ((NPC *)local_120._0_8_ != (NPC *)(local_120 + 0x10)) {
          operator_delete((void *)local_120._0_8_,local_110._0_8_ + 1);
        }
LAB_0017b2ee:
        if (bVar16) {
          PacketBuilder::SetID((PacketBuilder *)local_d8,(PacketFamily)local_6c,PACKET_ACCEPT);
          p_Var31 = local_48;
          bVar16 = true;
          PacketBuilder::ReserveMore((PacketBuilder *)local_d8,0x21);
        }
        else {
          bVar16 = false;
          p_Var31 = local_48;
        }
      }
      if (local_ec != -1) {
        PacketBuilder::AddShort((PacketBuilder *)local_d8,local_ec);
      }
      iVar17 = Character::PlayerID(local_e0);
      PacketBuilder::AddShort((PacketBuilder *)local_d8,iVar17);
      PacketBuilder::AddChar((PacketBuilder *)local_d8,(uint)local_e0->direction);
      PacketBuilder::AddShort((PacketBuilder *)local_d8,(uint)this->index);
      PacketBuilder::AddShort((PacketBuilder *)local_d8,(int)local_60);
      PacketBuilder::AddShort((PacketBuilder *)local_d8,local_58);
      PacketBuilder::AddChar((PacketBuilder *)local_d8,(uint)this->x);
      PacketBuilder::AddChar((PacketBuilder *)local_d8,(uint)this->y);
      PacketBuilder::AddInt((PacketBuilder *)local_d8,local_f0);
      PacketBuilder::AddThree((PacketBuilder *)local_d8,local_54);
      if (local_ec != -1) {
        PacketBuilder::AddShort((PacketBuilder *)local_d8,*(int *)(local_110._16_8_ + 0xcc));
      }
      if ((pCVar35 == (Character *)local_110._16_8_ && bVar39) ||
         (local_f4 != 0 && p_Var38 != p_Var31)) {
        PacketBuilder::AddInt((PacketBuilder *)local_d8,pCVar35->exp);
      }
      if (bVar16) {
        PacketBuilder::AddChar((PacketBuilder *)local_d8,(uint)pCVar35->level);
        PacketBuilder::AddShort((PacketBuilder *)local_d8,pCVar35->statpoints);
        PacketBuilder::AddShort((PacketBuilder *)local_d8,pCVar35->skillpoints);
        PacketBuilder::AddShort((PacketBuilder *)local_d8,pCVar35->maxhp);
        PacketBuilder::AddShort((PacketBuilder *)local_d8,pCVar35->maxtp);
        PacketBuilder::AddShort((PacketBuilder *)local_d8,pCVar35->maxsp);
      }
      Character::Send(pCVar35,(PacketBuilder *)local_d8);
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_d8);
LAB_0017b495:
      p_Var22 = local_e8->_M_next;
    } while (p_Var22 != local_38);
  }
  p_Var24 = (_Rb_tree_node_base *)local_a0._24_8_;
  if ((_Rb_tree_node_base *)local_a0._24_8_ != (_Rb_tree_node_base *)(local_a0 + 8)) {
    do {
      this_00 = *(Party **)(p_Var24 + 1);
      Party::ShareEXP(this_00,this_00->temp_expsum,sharemode,this->map);
      this_00->temp_expsum = 0;
      p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24);
    } while (p_Var24 != (_Rb_tree_node_base *)(local_a0 + 8));
  }
  plVar2 = &this->damagelist;
  p_Var22 = (this->damagelist).
            super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var22 != (_List_node_base *)plVar2) {
    do {
      lVar11 = (long)(p_Var22[1]._M_next)->_M_next;
      __last._M_node = (_List_node_base *)(lVar11 + 0x378);
      local_d8._0_8_ = this;
      __first = std::
                __remove_if<std::_List_iterator<NPC*>,__gnu_cxx::__ops::_Iter_equals_val<NPC*const>>
                          (*(_List_node_base **)(lVar11 + 0x378),__last,
                           (_Iter_equals_val<NPC_*const>)local_d8);
      std::__cxx11::list<NPC_*,_std::allocator<NPC_*>_>::erase
                ((list<NPC_*,_std::allocator<NPC_*>_> *)__last._M_node,
                 (const_iterator)__first._M_node,(p_Var22[1]._M_next)->_M_next + 0x378);
      p_Var22 = p_Var22->_M_next;
    } while (p_Var22 != (_List_node_base *)plVar2);
  }
  std::__cxx11::
  _List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  ::_M_clear(&plVar2->
              super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
            );
  (this->damagelist).
  super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
  (this->damagelist).
  super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar2;
  (this->damagelist).
  super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->totaldamage = 0;
  pNVar20 = World::GetNpcData(this->map->world,(short)this->id);
  pEVar23 = NPC_Data::ENF(pNVar20);
  if (pEVar23->boss != 0) {
    local_d8._0_8_ = (NPC *)0x0;
    local_d8._8_8_ = (NPC *)0x0;
    local_c8._0_8_ = (NPC **)0x0;
    ppNVar32 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppNVar12 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (ppNVar32 != ppNVar12) {
      do {
        local_120._0_8_ = *ppNVar32;
        pNVar20 = World::GetNpcData(((NPC *)local_120._0_8_)->map->world,
                                    (short)((NPC *)local_120._0_8_)->id);
        pEVar23 = NPC_Data::ENF(pNVar20);
        if (pEVar23->child != 0) {
          pNVar20 = World::GetNpcData((*(Map **)(local_120._0_8_ + 0x58))->world,
                                      (short)*(int *)(local_120._0_8_ + 0x68));
          pEVar23 = NPC_Data::ENF(pNVar20);
          if ((pEVar23->boss == 0) && (*(char *)(local_120._0_8_ + 0x10) == '\x01')) {
            if (local_d8._8_8_ == local_c8._0_8_) {
              std::vector<NPC*,std::allocator<NPC*>>::_M_realloc_insert<NPC*const&>
                        ((vector<NPC*,std::allocator<NPC*>> *)local_d8,(iterator)local_d8._8_8_,
                         (NPC **)local_120);
            }
            else {
              *(undefined8 *)local_d8._8_8_ = local_120._0_8_;
              local_d8._8_8_ = local_d8._8_8_ + 8;
            }
          }
        }
        uVar15 = local_d8._8_8_;
        ppNVar32 = ppNVar32 + 1;
      } while (ppNVar32 != ppNVar12);
      sVar28 = -1;
      for (pNVar36 = (NPC *)local_d8._0_8_; pNVar36 != (NPC *)uVar15;
          pNVar36 = (NPC *)&pNVar36->parent) {
        this_01 = *(NPC **)pNVar36;
        if ((this_01->temporary == false) && ((sVar28 == -1 || (this_01->id == (int)sVar28)))) {
          Die(this_01,false);
          sVar28 = (short)this_01->id;
        }
        else {
          Die(this_01,true);
        }
      }
      if ((NPC *)local_d8._0_8_ != (NPC *)0x0) {
        operator_delete((void *)local_d8._0_8_,local_c8._0_8_ - local_d8._0_8_);
      }
      if (sVar28 != -1) {
        PacketBuilder::PacketBuilder((PacketBuilder *)local_d8,PACKET_NPC,PACKET_JUNK,2);
        PacketBuilder::AddShort((PacketBuilder *)local_d8,(int)sVar28);
        plVar33 = &this->map->characters;
        p_Var22 = (_List_node_base *)plVar33;
        while (p_Var22 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)
                          &p_Var22->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var22 != (_List_node_base *)plVar33) {
          Character::Send((Character *)p_Var22[1]._M_next,(PacketBuilder *)local_d8);
        }
        PacketBuilder::~PacketBuilder((PacketBuilder *)local_d8);
      }
    }
  }
  if (this->temporary == true) {
    pMVar10 = this->map;
    local_d8._0_8_ = this;
    __dest = std::
             __remove_if<__gnu_cxx::__normal_iterator<NPC**,std::vector<NPC*,std::allocator<NPC*>>>,__gnu_cxx::__ops::_Iter_equals_val<NPC*const>>
                       ((__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>)
                        (pMVar10->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>)
                        (pMVar10->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                        super__Vector_impl_data._M_finish,(_Iter_equals_val<NPC_*const>)local_d8);
    ppNVar37 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (__dest._M_current != ppNVar37) {
      __n = (long)(pMVar10->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppNVar37;
      ppNVar27 = ppNVar37;
      if (__n != 0) {
        memmove(__dest._M_current,ppNVar37,__n);
        ppNVar27 = (pMVar10->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      ppNVar37 = __dest._M_current + ((long)ppNVar27 - (long)ppNVar37);
      if (ppNVar27 != ppNVar37) {
        (pMVar10->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppNVar37;
      }
    }
  }
  pmVar14 = (map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
             *)(local_110._16_8_ + 0x390);
  for (p_Var25 = (((map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
                    *)(local_110._16_8_ + 0x390))->_M_t)._M_impl.super__Rb_tree_header._M_header.
                 _M_left;
      (_Rb_tree_header *)p_Var25 != &(pmVar14->_M_t)._M_impl.super__Rb_tree_header;
      p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25)) {
    this_02 = (Quest_Context *)p_Var25[1]._M_parent;
    this_03 = p_Var25[1]._M_left;
    if (this_03 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&this_03->_M_parent = *(int *)&this_03->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&this_03->_M_parent = *(int *)&this_03->_M_parent + 1;
      }
    }
    if (this_02 != (Quest_Context *)0x0) {
      this_04 = Quest_Context::GetQuest(this_02);
      bVar39 = Quest::Disabled(this_04);
      if (!bVar39) {
        pNVar20 = World::GetNpcData(this->map->world,(short)this->id);
        pEVar23 = NPC_Data::ENF(pNVar20);
        Quest_Context::KilledNPC(this_02,(short)pEVar23->id);
      }
    }
    if (this_03 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03);
    }
  }
  if (this->temporary != false) {
    ~NPC(this);
    operator_delete(this,0x70);
  }
  std::
  _Rb_tree<Party_*,_Party_*,_std::_Identity<Party_*>,_std::less<Party_*>,_std::allocator<Party_*>_>
  ::~_Rb_tree((_Rb_tree<Party_*,_Party_*,_std::_Identity<Party_*>,_std::less<Party_*>,_std::allocator<Party_*>_>
               *)local_a0);
  return;
LAB_0017adc4:
  pCVar35 = (Character *)p_Var22->_M_next;
  goto LAB_0017adcc;
}

Assistant:

void NPC::Killed(Character *from, int amount, int spell_id)
{
	double droprate = this->map->world->config["DropRate"];
	double exprate = this->map->world->config["ExpRate"];
	int sharemode = this->map->world->config["ShareMode"];
	int partysharemode = this->map->world->config["PartyShareMode"];
	int dropratemode = this->map->world->config["DropRateMode"];
	std::set<Party *> parties;

	int most_damage_counter = 0;
	Character *most_damage = nullptr;
	NPC_Drop *drop = nullptr;

	this->alive = false;

	this->dead_since = int(Timer::GetTime());

	if (dropratemode == 1)
	{
		std::vector<NPC_Drop *> drops;

		UTIL_FOREACH_CREF(this->Data().drops, checkdrop)
		{
			if (util::rand(0.0, 100.0) <= checkdrop->chance * droprate)
			{
				drops.push_back(checkdrop.get());
			}
		}

		if (drops.size() > 0)
		{
			drop = drops[util::rand(0, drops.size()-1)];
		}
	}
	else if (dropratemode == 2)
	{
		UTIL_FOREACH_CREF(this->Data().drops, checkdrop)
		{
			if (util::rand(0.0, 100.0) <= checkdrop->chance * droprate)
			{
				drop = checkdrop.get();
				break;
			}
		}
	}
	else if (dropratemode == 3)
	{
		double roll = util::rand(0.0, this->Data().drops_chance_total);

		UTIL_FOREACH_CREF(this->Data().drops, checkdrop)
		{
			if (roll >= checkdrop->chance_offset && roll < checkdrop->chance_offset+checkdrop->chance)
			{
				drop = checkdrop.get();
				break;
			}
		}
	}

	if (sharemode == 1)
	{
		UTIL_FOREACH_CREF(this->damagelist, opponent)
		{
			if (opponent->damage > most_damage_counter)
			{
				most_damage_counter = opponent->damage;
				most_damage = opponent->attacker;
			}
		}
	}

	int dropuid = 0;
	int dropid = 0;
	int dropamount = 0;
	Character* drop_winner = nullptr;

	if (drop)
	{
		dropid = drop->id;
		dropamount = std::min<int>(util::rand(drop->min, drop->max), this->map->world->config["MaxItem"]);

		if (dropid <= 0 || static_cast<std::size_t>(dropid) >= this->map->world->eif->data.size() || dropamount <= 0)
			goto abort_drop;

		dropuid = this->map->GenerateItemID();

		std::shared_ptr<Map_Item> newitem(std::make_shared<Map_Item>(dropuid, dropid, dropamount, this->x, this->y, from->PlayerID(), Timer::GetTime() + static_cast<int>(this->map->world->config["ProtectNPCDrop"])));
		this->map->items.push_back(newitem);

		// Selects a random number between 0 and maxhp, and decides the winner based on that
		switch (sharemode)
		{
			case 0:
				drop_winner = from;
				break;

			case 1:
				drop_winner = most_damage;
				break;

			case 2:
			{
				int rewarded_hp = util::rand(0, this->totaldamage - 1);
				int count_hp = 0;
				UTIL_FOREACH_CREF(this->damagelist, opponent)
				{
					if (opponent->attacker->InRange(this))
					{
						if (rewarded_hp >= count_hp && rewarded_hp < opponent->damage)
						{
							drop_winner = opponent->attacker;
							break;
						}

						count_hp += opponent->damage;
					}
				}
			}
				break;

			case 3:
			{
				int rand = util::rand(0, this->damagelist.size() - 1);
				int i = 0;
				UTIL_FOREACH_CREF(this->damagelist, opponent)
				{
					if (opponent->attacker->InRange(this))
					{
						if (rand == i++)
						{
							drop_winner = opponent->attacker;
							break;
						}
					}
				}
			}
				break;
		}
	}
	abort_drop:

	if (drop_winner)
		this->map->items.back()->owner = drop_winner->PlayerID();

	UTIL_FOREACH(this->map->characters, character)
	{
		std::list<std::unique_ptr<NPC_Opponent>>::iterator findopp = this->damagelist.begin();
		for (; findopp != this->damagelist.end() && (*findopp)->attacker != character; ++findopp); // no loop body

		if (findopp != this->damagelist.end() || character->InRange(this))
		{
			bool level_up = false;

			PacketBuilder builder(spell_id == -1 ? PACKET_NPC : PACKET_CAST, PACKET_SPEC, 26);

			if (this->ENF().exp != 0)
			{
				if (findopp != this->damagelist.end())
				{
					int reward;
					switch (sharemode)
					{
						case 0:
							if (character == from)
							{
								reward = int(std::ceil(double(this->ENF().exp) * exprate));

								if (reward > 0)
								{
									if (partysharemode)
									{
										if (character->party)
										{
											character->party->ShareEXP(reward, partysharemode, this->map);
										}
										else
										{
											character->exp += reward;
										}
									}
									else
									{
										character->exp += reward;
									}
								}
							}
							break;

						case 1:
							if (character == most_damage)
							{
								reward = int(std::ceil(double(this->ENF().exp) * exprate));

								if (reward > 0)
								{
									if (partysharemode)
									{
										if (character->party)
										{
											character->party->ShareEXP(reward, partysharemode, this->map);
										}
										else
										{
											character->exp += reward;
										}
									}
									else
									{
										character->exp += reward;
									}
								}
							}
							break;

						case 2:
							reward = int(std::ceil(double(this->ENF().exp) * exprate * (double((*findopp)->damage) / double(this->totaldamage))));

							if (reward > 0)
							{
								if (partysharemode)
								{
									if (character->party)
									{
										character->party->temp_expsum += reward;
										parties.insert(character->party);
									}
									else
									{
										character->exp += reward;
									}
								}
								else
								{
									character->exp += reward;
								}
							}
							break;

						case 3:
							reward = int(std::ceil(double(this->ENF().exp) * exprate * (double(this->damagelist.size()) / 1.0)));

							if (reward > 0)
							{
								if (partysharemode)
								{
									if (character->party)
									{
										character->party->temp_expsum += reward;
									}
									else
									{
										character->exp += reward;
									}
								}
								else
								{
									character->exp += reward;
								}
							}
							break;
					}

					character->exp = std::min(character->exp, static_cast<int>(this->map->world->config["MaxExp"]));

					while (character->level < static_cast<int>(this->map->world->config["MaxLevel"]) && character->exp >= this->map->world->exp_table[character->level+1])
					{
						level_up = true;
						++character->level;
						character->statpoints += static_cast<int>(this->map->world->config["StatPerLevel"]);
						character->skillpoints += static_cast<int>(this->map->world->config["SkillPerLevel"]);
						character->CalculateStats();
					}

					if (level_up)
					{
						builder.SetID(spell_id == -1 ? PACKET_NPC : PACKET_CAST, PACKET_ACCEPT);
						builder.ReserveMore(33);
					}
				}
			}

			if (spell_id != -1)
				builder.AddShort(spell_id);

			builder.AddShort(drop_winner ? drop_winner->PlayerID() : from->PlayerID());
			builder.AddChar(drop_winner ? drop_winner->direction : from->direction);
			builder.AddShort(this->index);
			builder.AddShort(dropuid);
			builder.AddShort(dropid);
			builder.AddChar(this->x);
			builder.AddChar(this->y);
			builder.AddInt(dropamount);
			builder.AddThree(amount);

			if (spell_id != -1)
				builder.AddShort(from->tp);

			if ((sharemode == 0 && character == from) || (sharemode != 0 && findopp != this->damagelist.end()))
			{
				builder.AddInt(character->exp);
			}

			if (level_up)
			{
				builder.AddChar(character->level);
				builder.AddShort(character->statpoints);
				builder.AddShort(character->skillpoints);
				builder.AddShort(character->maxhp);
				builder.AddShort(character->maxtp);
				builder.AddShort(character->maxsp);
			}

			character->Send(builder);
		}
	}

	UTIL_FOREACH(parties, party)
	{
		party->ShareEXP(party->temp_expsum, partysharemode, this->map);
		party->temp_expsum = 0;
	}

	UTIL_FOREACH_CREF(this->damagelist, opponent)
	{
		opponent->attacker->unregister_npc.erase(
			std::remove(UTIL_RANGE(opponent->attacker->unregister_npc), this),
			opponent->attacker->unregister_npc.end()
		);
	}

	this->damagelist.clear();
	this->totaldamage = 0;

	short childid = -1;

	if (this->ENF().boss)
	{
		std::vector<NPC*> child_npcs;

		UTIL_FOREACH(this->map->npcs, npc)
		{
			if (npc->ENF().child && !npc->ENF().boss && npc->alive)
			{
				child_npcs.push_back(npc);
			}
		}

		UTIL_FOREACH(child_npcs, npc)
		{
			if (!npc->temporary && (childid == -1 || childid == npc->id))
			{
				npc->Die(false);
				childid = npc->id;
			}
			else
			{
				npc->Die(true);
			}
		}
	}

	if (childid != -1)
	{
		PacketBuilder builder(PACKET_NPC, PACKET_JUNK, 2);
		builder.AddShort(childid);

		UTIL_FOREACH(this->map->characters, character)
		{
			character->Send(builder);
		}
	}

	if (this->temporary)
	{
		this->map->npcs.erase(
			std::remove(this->map->npcs.begin(), this->map->npcs.end(), this),
			this->map->npcs.end()
		);
	}

	UTIL_FOREACH(from->quests, q)
	{
		if (!q.second || q.second->GetQuest()->Disabled())
			continue;

		q.second->KilledNPC(this->ENF().id);
	}

	if (this->temporary)
	{
		delete this;
		return;
	}
}